

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
::
insert<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,unsigned_int&>
          (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
           *this,ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
                 table,size_t pos,uint *params)

{
  uint uVar1;
  uint uVar2;
  ArrayDisposer *pAVar3;
  uint uVar4;
  Entry *this_00;
  HashBucket *pHVar5;
  ArrayDisposer *pAVar6;
  uint *in_R9;
  HashBucket *pHVar7;
  Maybe<unsigned_long> MVar8;
  
  this_00 = table.ptr;
  pAVar3 = (this_00->value).paramExports.disposer;
  if ((ulong)((long)pAVar3 * 2) < ((long)(this_00->value).paramExports.ptr + pos) * 3 + 3) {
    HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
    ::rehash((HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
              *)this_00,pos * 3 + 3);
    pAVar3 = (this_00->value).paramExports.disposer;
  }
  uVar1 = *in_R9;
  uVar4 = uVar1 * 0x8000 + ~uVar1;
  uVar4 = (uVar4 >> 0xc ^ uVar4) * 5;
  uVar4 = (uVar4 >> 4 ^ uVar4) * 0x809;
  MVar8.ptr.field_1._0_4_ = uVar4 >> 0x10 ^ uVar4;
  uVar4 = (int)pAVar3 - 1U & MVar8.ptr.field_1._0_4_;
  pHVar5 = (HashBucket *)0x0;
  do {
    pHVar7 = ((Array<kj::_::HashBucket> *)&(this_00->value).paramExports.size_)->ptr + uVar4;
    uVar2 = pHVar7->value;
    if (uVar2 == 1) {
      if (pHVar5 == (HashBucket *)0x0) {
        pHVar5 = pHVar7;
      }
    }
    else {
      if (uVar2 == 0) {
        if (pHVar5 != (HashBucket *)0x0) {
          (this_00->value).paramExports.ptr = (uint *)((long)(this_00->value).paramExports.ptr - 1);
          pHVar7 = pHVar5;
        }
        *pHVar7 = (HashBucket)
                  (((ulong)MVar8.ptr.field_1._0_4_ | (long)params << 0x20) + 0x200000000);
        *this = (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
                 )0x0;
        goto LAB_0032d251;
      }
      if ((pHVar7->hash == MVar8.ptr.field_1._0_4_) &&
         (*(uint *)(table.size_ + (ulong)(uVar2 - 2) * 0x30) == uVar1)) {
        *this = (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
                 )0x1;
        *(ulong *)(this + 8) = (ulong)(uVar2 - 2);
LAB_0032d251:
        MVar8.ptr._0_8_ = this;
        MVar8.ptr.field_1.value._4_4_ = 0;
        return (Maybe<unsigned_long>)MVar8.ptr;
      }
    }
    pAVar6 = (ArrayDisposer *)((ulong)uVar4 + 1);
    uVar4 = (uint)pAVar6;
    if (pAVar6 == pAVar3) {
      uVar4 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }